

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash.cpp
# Opt level: O2

void __thiscall NJamSpell::TPerfectHash::Dump(TPerfectHash *this,ostream *out)

{
  bool *object;
  
  object = (bool *)this->Phf;
  NHandyPack::TPodSerializer<unsigned_long>::Dump(out,(unsigned_long *)(object + 0x20));
  NHandyPack::
  TPodSerializer<phf::(unnamed_enum_at_/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.h:144:2)>
  ::Dump(out,(anon_enum_32 *)(object + 0x28));
  NHandyPack::TPodSerializer<unsigned_long>::Dump(out,(unsigned_long *)(object + 0x10));
  NHandyPack::TPodSerializer<unsigned_long>::Dump(out,(unsigned_long *)(object + 8));
  NHandyPack::TPodSerializer<unsigned_int>::Dump(out,(uint *)(object + 4));
  NHandyPack::TPodSerializer<bool>::Dump(out,object);
  std::ostream::write((char *)out,*(long *)(object + 0x18));
  return;
}

Assistant:

void TPerfectHash::Dump(std::ostream& out) const {
    const phf& perfHash = *(const phf*)Phf;
    NHandyPack::Dump(out, perfHash.d_max,
                         perfHash.g_op,
                         perfHash.m,
                         perfHash.r,
                         perfHash.seed,
                         perfHash.nodiv);
    out.write((const char*)perfHash.g, perfHash.r * sizeof(uint32_t));
}